

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printNasmStats(Stats *stats)

{
  ostream *poVar1;
  anon_class_1_0_00000001 local_1b;
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"#Jump = ",8);
  mocker::nasm::Stats::
  countInstsIf<mocker::nasm::Stats::countJumps()const::_lambda(auto:1_const&)_1_>(stats,&local_1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"#insts = ",9);
  mocker::nasm::Stats::
  countInstsIf<mocker::nasm::Stats::countInsts()const::_lambda(auto:1_const&)_1_>(stats,&local_1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"#MemOperation = ",0x10);
  mocker::nasm::Stats::
  countInstsIf<mocker::nasm::Stats::countMemOperation()const::_lambda(auto:1_const&)_1_>
            (stats,&local_19);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void printNasmStats(const mocker::nasm::Stats &stats) {
  using namespace mocker::nasm;
  std::cerr << "#Jump = " << stats.countJumps() << std::endl;
  std::cerr << "#insts = " << stats.countInsts() << std::endl;
  std::cerr << "#MemOperation = " << stats.countMemOperation() << std::endl;
}